

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O0

void __thiscall
IntrusiveListTest_push_back_pointer_Test::TestBody(IntrusiveListTest_push_back_pointer_Test *this)

{
  initializer_list<int> __l;
  allocator<int> local_8d;
  int local_8c [3];
  iterator local_80;
  size_type local_78;
  vector<int,_std::allocator<int>_> local_70;
  undefined4 local_54;
  unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
  local_50;
  undefined4 local_44;
  unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
  local_40;
  undefined4 local_34;
  unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
  local_30;
  undefined1 local_28 [8];
  TestObjectList list;
  IntrusiveListTest_push_back_pointer_Test *this_local;
  
  list.size_ = (size_t)this;
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::intrusive_list
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_34 = 1;
  std::make_unique<(anonymous_namespace)::TestObject,int>((int *)&local_30);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::push_back
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28,&local_30);
  std::
  unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
  ::~unique_ptr(&local_30);
  local_44 = 2;
  std::make_unique<(anonymous_namespace)::TestObject,int>((int *)&local_40);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::push_back
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28,&local_40);
  std::
  unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
  ::~unique_ptr(&local_40);
  local_54 = 3;
  std::make_unique<(anonymous_namespace)::TestObject,int>((int *)&local_50);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::push_back
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28,&local_50);
  std::
  unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
  ::~unique_ptr(&local_50);
  local_8c[0] = 1;
  local_8c[1] = 2;
  local_8c[2] = 3;
  local_80 = local_8c;
  local_78 = 3;
  std::allocator<int>::allocator(&local_8d);
  __l._M_len = local_78;
  __l._M_array = local_80;
  std::vector<int,_std::allocator<int>_>::vector(&local_70,__l,&local_8d);
  anon_unknown.dwarf_5bdeb::IntrusiveListTest::AssertListEq
            (&this->super_IntrusiveListTest,(TestObjectList *)local_28,&local_70);
  std::vector<int,_std::allocator<int>_>::~vector(&local_70);
  std::allocator<int>::~allocator(&local_8d);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::~intrusive_list
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  return;
}

Assistant:

TEST_F(IntrusiveListTest, push_back_pointer) {
  TestObjectList list;

  list.push_back(std::make_unique<TestObject>(1));
  list.push_back(std::make_unique<TestObject>(2));
  list.push_back(std::make_unique<TestObject>(3));

  AssertListEq(list, {1, 2, 3});
}